

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O2

int mbedtls_pk_check_pair(mbedtls_pk_context *pub,mbedtls_pk_context *prv)

{
  mbedtls_pk_info_t *pmVar1;
  mbedtls_pk_info_t *pmVar2;
  int iVar3;
  
  if ((((pub != (mbedtls_pk_context *)0x0) &&
       (pmVar1 = pub->pk_info,
       prv != (mbedtls_pk_context *)0x0 && pmVar1 != (mbedtls_pk_info_t *)0x0)) &&
      (pmVar2 = prv->pk_info, pmVar2 != (mbedtls_pk_info_t *)0x0)) &&
     (pmVar2->check_pair_func != (_func_int_void_ptr_void_ptr *)0x0)) {
    if (pmVar2->type == MBEDTLS_PK_RSA_ALT) {
      if (pmVar1->type != MBEDTLS_PK_RSA) {
        return -0x3f00;
      }
    }
    else if (pmVar1 != pmVar2) {
      return -0x3f00;
    }
    iVar3 = (*pmVar2->check_pair_func)(pub->pk_ctx,prv->pk_ctx);
    return iVar3;
  }
  return -16000;
}

Assistant:

int mbedtls_pk_check_pair( const mbedtls_pk_context *pub, const mbedtls_pk_context *prv )
{
    if( pub == NULL || pub->pk_info == NULL ||
        prv == NULL || prv->pk_info == NULL ||
        prv->pk_info->check_pair_func == NULL )
    {
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
    }

    if( prv->pk_info->type == MBEDTLS_PK_RSA_ALT )
    {
        if( pub->pk_info->type != MBEDTLS_PK_RSA )
            return( MBEDTLS_ERR_PK_TYPE_MISMATCH );
    }
    else
    {
        if( pub->pk_info != prv->pk_info )
            return( MBEDTLS_ERR_PK_TYPE_MISMATCH );
    }

    return( prv->pk_info->check_pair_func( pub->pk_ctx, prv->pk_ctx ) );
}